

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AddressFilter.cpp
# Opt level: O3

void __thiscall AddressFilter::AddToList(AddressFilter *this,char *addrText)

{
  int iVar1;
  size_t len;
  uint8_t *addr;
  in_addr ipv4_addr;
  in6_addr ipv6_addr;
  uint8_t local_2c [4];
  uint8_t local_28 [16];
  
  addr = local_2c;
  iVar1 = inet_pton(2,addrText,addr);
  len = 4;
  if (iVar1 != 1) {
    addr = local_28;
    iVar1 = inet_pton(10,addrText,addr);
    len = 0x10;
    if (iVar1 != 1) {
      return;
    }
  }
  AddToList(this,addr,len);
  return;
}

Assistant:

void AddressFilter::AddToList(char const * addrText)
{
    uint8_t * addr_bin = NULL;
    size_t addr_len = 0;
    struct in_addr ipv4_addr;
    struct in6_addr ipv6_addr;

    if (inet_pton(AF_INET, addrText, &ipv4_addr) == 1)
    {
        /* Valid IPv4 address */
        addr_bin = (uint8_t *)&ipv4_addr;
        addr_len = sizeof(struct in_addr);
    }
    else  if (inet_pton(AF_INET6, addrText, &ipv6_addr) == 1)
    {
        /* Valid IPv6 address */
        addr_bin = (uint8_t *)&ipv6_addr;
        addr_len = sizeof(struct in6_addr);
    }

    if (addr_len > 0)
    {
        AddToList(addr_bin, addr_len);
    }
}